

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

void __thiscall PClassActor::SetDamageFactor(PClassActor *this,FName *type,double factor)

{
  TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_> *this_00;
  DmgFactors *this_01;
  FName local_30 [4];
  double local_20;
  double factor_local;
  FName *type_local;
  PClassActor *this_local;
  
  local_20 = factor;
  factor_local = (double)type;
  type_local = (FName *)this;
  if (this->DamageFactors == (DmgFactors *)0x0) {
    this_01 = (DmgFactors *)operator_new(0x18);
    DmgFactors::DmgFactors(this_01);
    this->DamageFactors = this_01;
  }
  this_00 = &this->DamageFactors->
             super_TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>;
  FName::FName(local_30,type);
  TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>::Insert(this_00,local_30,&local_20)
  ;
  return;
}

Assistant:

void PClassActor::SetDamageFactor(FName type, double factor)
{
	if (DamageFactors == NULL)
	{
		DamageFactors = new DmgFactors;
	}
	DamageFactors->Insert(type, factor);
}